

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KRef_Ptr.h
# Opt level: O3

KRef_Ptr<KDIS::DATA_TYPE::GridData> * __thiscall
KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::operator=
          (KRef_Ptr<KDIS::DATA_TYPE::GridData> *this,KRef_Ptr<KDIS::DATA_TYPE::GridData> *p)

{
  GridData *pGVar1;
  RefCounter *pRVar2;
  
  if (this->m_pRef != p->m_pRef) {
    unRef(this);
    pGVar1 = p->m_pRef;
    this->m_pRef = pGVar1;
    pRVar2 = p->m_piCount;
    this->m_piCount = pRVar2;
    if (pGVar1 != (GridData *)0x0) {
      *pRVar2 = *pRVar2 + 1;
    }
  }
  return this;
}

Assistant:

KRef_Ptr<Type> & operator=( const KRef_Ptr<Type> & p )
    {
        if( m_pRef == p.m_pRef )return *this;
        unRef();
        m_pRef = p.m_pRef;
        m_piCount = p.m_piCount;
        ref();
        return *this;
    }